

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tribench.c
# Opt level: O0

void generateTriangles(uint count)

{
  undefined8 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  TriVertex *pTVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  AVec3f AVar11;
  AVec3f AVar12;
  AVec3f center;
  TriVertex *v;
  ALCGRand AStack_18;
  uint i;
  ALCGRand rng;
  uint count_local;
  
  AStack_18.state_ = (uint64_t)count;
  g.vertices_count = count * 6;
  rng.state_._4_4_ = count;
  g.vertices = (TriVertex *)malloc((ulong)g.vertices_count * 0x30);
  for (v._4_4_ = 0; v._4_4_ < rng.state_._4_4_; v._4_4_ = v._4_4_ + 1) {
    pTVar7 = g.vertices + v._4_4_ * 6;
    AVar11 = randomVector(&stack0xffffffffffffffe8,1.0);
    pTVar7[2].tricenter.z = AVar11.z;
    pTVar7[2].tricenter.x = (float)(int)AVar11._0_8_;
    pTVar7[2].tricenter.y = (float)(int)((ulong)AVar11._0_8_ >> 0x20);
    pTVar7[1].tricenter.z = pTVar7[2].tricenter.z;
    fVar8 = pTVar7[2].tricenter.y;
    pTVar7[1].tricenter.x = pTVar7[2].tricenter.x;
    pTVar7[1].tricenter.y = fVar8;
    (pTVar7->tricenter).z = pTVar7[1].tricenter.z;
    fVar8 = pTVar7[1].tricenter.y;
    (pTVar7->tricenter).x = pTVar7[1].tricenter.x;
    (pTVar7->tricenter).y = fVar8;
    AVar12 = randomVector(&stack0xffffffffffffffe8,0.1);
    AVar12 = aVec3fAdd(AVar11,AVar12);
    (pTVar7->pos).z = AVar12.z;
    (pTVar7->pos).x = (float)(int)AVar12._0_8_;
    (pTVar7->pos).y = (float)(int)((ulong)AVar12._0_8_ >> 0x20);
    AVar12 = randomVector(&stack0xffffffffffffffe8,0.1);
    AVar12 = aVec3fAdd(AVar11,AVar12);
    pTVar7[1].pos.z = AVar12.z;
    pTVar7[1].pos.x = (float)(int)AVar12._0_8_;
    pTVar7[1].pos.y = (float)(int)((ulong)AVar12._0_8_ >> 0x20);
    AVar12 = randomVector(&stack0xffffffffffffffe8,0.1);
    AVar11 = aVec3fAdd(AVar11,AVar12);
    pTVar7[2].pos.z = AVar11.z;
    pTVar7[2].pos.x = (float)(int)AVar11._0_8_;
    pTVar7[2].pos.y = (float)(int)((ulong)AVar11._0_8_ >> 0x20);
    AVar11 = aVec3fSub(pTVar7->pos,pTVar7[1].pos);
    AVar12 = aVec3fSub(pTVar7[2].pos,pTVar7[1].pos);
    AVar11 = aVec3fCross(AVar11,AVar12);
    AVar11 = aVec3fNormalize(AVar11);
    pTVar7[2].normal.z = AVar11.z;
    pTVar7[2].normal.x = (float)(int)AVar11._0_8_;
    pTVar7[2].normal.y = (float)(int)((ulong)AVar11._0_8_ >> 0x20);
    pTVar7[1].normal.z = pTVar7[2].normal.z;
    fVar8 = pTVar7[2].normal.y;
    pTVar7[1].normal.x = pTVar7[2].normal.x;
    pTVar7[1].normal.y = fVar8;
    (pTVar7->normal).z = pTVar7[1].normal.z;
    fVar8 = pTVar7[1].normal.y;
    (pTVar7->normal).x = pTVar7[1].normal.x;
    (pTVar7->normal).y = fVar8;
    fVar8 = aLcgRandf(&stack0xffffffffffffffe8);
    fVar9 = aLcgRandf(&stack0xffffffffffffffe8);
    fVar10 = aLcgRandf(&stack0xffffffffffffffe8);
    AVar11 = aVec3f(fVar8,fVar9,fVar10);
    pTVar7[2].color.z = AVar11.z;
    pTVar7[2].color.x = (float)(int)AVar11._0_8_;
    pTVar7[2].color.y = (float)(int)((ulong)AVar11._0_8_ >> 0x20);
    pTVar7[1].color.z = pTVar7[2].color.z;
    fVar8 = pTVar7[2].color.y;
    pTVar7[1].color.x = pTVar7[2].color.x;
    pTVar7[1].color.y = fVar8;
    (pTVar7->color).z = pTVar7[1].color.z;
    fVar8 = pTVar7[1].color.y;
    (pTVar7->color).x = pTVar7[1].color.x;
    (pTVar7->color).y = fVar8;
    fVar5 = (pTVar7->pos).x;
    fVar6 = (pTVar7->pos).y;
    uVar1 = *(undefined8 *)&(pTVar7->pos).z;
    fVar10 = (pTVar7->tricenter).y;
    fVar2 = (pTVar7->tricenter).z;
    fVar3 = (pTVar7->normal).x;
    fVar4 = (pTVar7->normal).y;
    fVar8 = (pTVar7->color).y;
    fVar9 = (pTVar7->color).z;
    *(undefined8 *)&pTVar7[3].normal.z = *(undefined8 *)&(pTVar7->normal).z;
    pTVar7[3].color.y = fVar8;
    pTVar7[3].color.z = fVar9;
    pTVar7[3].tricenter.y = fVar10;
    pTVar7[3].tricenter.z = fVar2;
    pTVar7[3].normal.x = fVar3;
    pTVar7[3].normal.y = fVar4;
    pTVar7[3].pos.x = fVar5;
    pTVar7[3].pos.y = fVar6;
    *(undefined8 *)&pTVar7[3].pos.z = uVar1;
    fVar5 = pTVar7[2].pos.x;
    fVar6 = pTVar7[2].pos.y;
    uVar1 = *(undefined8 *)&pTVar7[2].pos.z;
    fVar10 = pTVar7[2].tricenter.y;
    fVar2 = pTVar7[2].tricenter.z;
    fVar3 = pTVar7[2].normal.x;
    fVar4 = pTVar7[2].normal.y;
    fVar8 = pTVar7[2].color.y;
    fVar9 = pTVar7[2].color.z;
    *(undefined8 *)&pTVar7[4].normal.z = *(undefined8 *)&pTVar7[2].normal.z;
    pTVar7[4].color.y = fVar8;
    pTVar7[4].color.z = fVar9;
    pTVar7[4].tricenter.y = fVar10;
    pTVar7[4].tricenter.z = fVar2;
    pTVar7[4].normal.x = fVar3;
    pTVar7[4].normal.y = fVar4;
    pTVar7[4].pos.x = fVar5;
    pTVar7[4].pos.y = fVar6;
    *(undefined8 *)&pTVar7[4].pos.z = uVar1;
    fVar5 = pTVar7[1].pos.x;
    fVar6 = pTVar7[1].pos.y;
    uVar1 = *(undefined8 *)&pTVar7[1].pos.z;
    fVar10 = pTVar7[1].tricenter.y;
    fVar2 = pTVar7[1].tricenter.z;
    fVar3 = pTVar7[1].normal.x;
    fVar4 = pTVar7[1].normal.y;
    fVar8 = pTVar7[1].color.y;
    fVar9 = pTVar7[1].color.z;
    *(undefined8 *)&pTVar7[5].normal.z = *(undefined8 *)&pTVar7[1].normal.z;
    pTVar7[5].color.y = fVar8;
    pTVar7[5].color.z = fVar9;
    pTVar7[5].tricenter.y = fVar10;
    pTVar7[5].tricenter.z = fVar2;
    pTVar7[5].normal.x = fVar3;
    pTVar7[5].normal.y = fVar4;
    pTVar7[5].pos.x = fVar5;
    pTVar7[5].pos.y = fVar6;
    *(undefined8 *)&pTVar7[5].pos.z = uVar1;
    AVar11 = aVec3fMulf(pTVar7->normal,-1.0);
    pTVar7[5].normal.x = (float)(int)AVar11._0_8_;
    pTVar7[5].normal.y = (float)(int)((ulong)AVar11._0_8_ >> 0x20);
    pTVar7[5].normal.z = AVar11.z;
    fVar8 = pTVar7[5].normal.y;
    pTVar7[4].normal.x = pTVar7[5].normal.x;
    pTVar7[4].normal.y = fVar8;
    pTVar7[4].normal.z = pTVar7[5].normal.z;
    fVar8 = pTVar7[4].normal.y;
    pTVar7[3].normal.x = pTVar7[4].normal.x;
    pTVar7[3].normal.y = fVar8;
    pTVar7[3].normal.z = pTVar7[4].normal.z;
  }
  return;
}

Assistant:

static void generateTriangles(unsigned int count) {
	struct ALCGRand rng = {count};

	g.vertices_count = count * 6;
	g.vertices = malloc(sizeof(*g.vertices) * g.vertices_count);
	for (unsigned int i = 0; i < count; ++i) {
		struct TriVertex *v = g.vertices + i * 6;
		const struct AVec3f center = randomVector(&rng, 1.f);
		v[0].tricenter = v[1].tricenter = v[2].tricenter = center;
		v[0].pos = aVec3fAdd(center, randomVector(&rng, .1f));
		v[1].pos = aVec3fAdd(center, randomVector(&rng, .1f));
		v[2].pos = aVec3fAdd(center, randomVector(&rng, .1f));
		v[0].normal = v[1].normal = v[2].normal =
			aVec3fNormalize(aVec3fCross(aVec3fSub(v[0].pos, v[1].pos), aVec3fSub(v[2].pos, v[1].pos)));
		v[0].color = v[1].color = v[2].color = aVec3f(aLcgRandf(&rng), aLcgRandf(&rng), aLcgRandf(&rng));

		v[3] = v[0];
		v[4] = v[2];
		v[5] = v[1];
		v[3].normal = v[4].normal = v[5].normal = aVec3fMulf(v[0].normal, -1.f);
	}
}